

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O1

void __thiscall TEST_GROUP_CppUTestGroupPluginTest::setup(TEST_GROUP_CppUTestGroupPluginTest *this)

{
  DummyPlugin *pDVar1;
  TestPlugin *this_00;
  TestTestingFixture *this_01;
  TestRegistry *pTVar2;
  SimpleString SStack_28;
  
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5d);
  SimpleString::SimpleString(&SStack_28,"GenericPlugin");
  TestPlugin::TestPlugin((TestPlugin *)pDVar1,&SStack_28);
  (pDVar1->super_TestPlugin)._vptr_TestPlugin = (_func_int **)&PTR__TestPlugin_00351c98;
  *(undefined8 *)&(pDVar1->super_TestPlugin).field_0x24 = 0;
  pDVar1->postAction = 0;
  pDVar1->postActionSequence = 0;
  this->firstPlugin = pDVar1;
  SimpleString::~SimpleString(&SStack_28);
  this_00 = (TestPlugin *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x5e);
  SimpleString::SimpleString(&SStack_28,"GenericPlugin2");
  TestPlugin::TestPlugin(this_00,&SStack_28);
  *(undefined8 *)&this_00->field_0x24 = 0;
  *(undefined8 *)((long)&this_00[1]._vptr_TestPlugin + 4) = 0;
  this_00->_vptr_TestPlugin = (_func_int **)&PTR__TestPlugin_00351d38;
  this->secondPlugin = (DummyPluginWhichAcceptsParameters *)this_00;
  SimpleString::~SimpleString(&SStack_28);
  pDVar1 = (DummyPlugin *)
           operator_new(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                        ,0x5f);
  SimpleString::SimpleString(&SStack_28,"GenericPlugin3");
  TestPlugin::TestPlugin((TestPlugin *)pDVar1,&SStack_28);
  (pDVar1->super_TestPlugin)._vptr_TestPlugin = (_func_int **)&PTR__TestPlugin_00351c98;
  *(undefined8 *)&(pDVar1->super_TestPlugin).field_0x24 = 0;
  pDVar1->postAction = 0;
  pDVar1->postActionSequence = 0;
  this->thirdPlugin = pDVar1;
  SimpleString::~SimpleString(&SStack_28);
  this_01 = (TestTestingFixture *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                         ,0x60);
  TestTestingFixture::TestTestingFixture(this_01);
  this->genFixture = this_01;
  pTVar2 = TestTestingFixture::getRegistry(this_01);
  this->registry = pTVar2;
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2,this->firstPlugin);
  sequenceNumber = 1;
  return;
}

Assistant:

void setup() _override
    {
        firstPlugin = new DummyPlugin(GENERIC_PLUGIN);
        secondPlugin = new DummyPluginWhichAcceptsParameters(GENERIC_PLUGIN2);
        thirdPlugin = new DummyPlugin(GENERIC_PLUGIN3);
        genFixture = new TestTestingFixture;
        registry = genFixture->getRegistry();
        registry->installPlugin(firstPlugin);
        sequenceNumber = 1;
    }